

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<double>_>::PrepareZ
          (TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *y,TPZFMatrix<Fad<double>_> *z,
          Fad<double> *beta,int opt)

{
  double *pdVar1;
  int64_t iVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  Fad<double> *in_RCX;
  TPZFMatrix<Fad<double>_> *in_RDX;
  TPZFMatrix<Fad<double>_> *in_RSI;
  TPZBaseMatrix *in_RDI;
  int in_R8D;
  int64_t i;
  Fad<double> *yp;
  Fad<double> *zlast;
  Fad<double> *zp;
  int64_t ic;
  int64_t xcols;
  int64_t numeq;
  undefined7 in_stack_ffffffffffffff40;
  byte in_stack_ffffffffffffff47;
  double *val;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffff60;
  long local_98;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar5;
  Fad<double> *in_stack_ffffffffffffff90;
  Fad<double> *local_48;
  long local_40;
  
  if (in_R8D == 0) {
    pdVar1 = (double *)TPZBaseMatrix::Rows(in_RDI);
  }
  else {
    pdVar1 = (double *)TPZBaseMatrix::Cols(in_RDI);
  }
  val = pdVar1;
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  (*(in_RDX->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xd])(in_RDX,pdVar1,iVar2);
  for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
    local_48 = TPZFMatrix<Fad<double>_>::operator()
                         (in_stack_ffffffffffffff60,(int64_t)in_RDI,(int64_t)in_RCX);
    pFVar3 = local_48 + (long)pdVar1;
    uVar5 = 0;
    pFVar4 = (Fad<double> *)&stack0xffffffffffffff90;
    Fad<double>::Fad<int,_nullptr>(in_RCX,(int *)val);
    in_stack_ffffffffffffff47 =
         ::operator!=((Fad<double> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                      pFVar4);
    Fad<double>::~Fad((Fad<double> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    if ((in_stack_ffffffffffffff47 & 1) == 0) {
      for (; local_48 != pFVar3; local_48 = local_48 + 1) {
        in_stack_ffffffffffffff60 = (TPZFMatrix<Fad<double>_> *)0x0;
        Fad<double>::operator=<double,_nullptr>(in_RCX,val);
      }
    }
    else {
      pFVar4 = TPZFMatrix<Fad<double>_>::g(in_RSI,0,local_40);
      if (in_RDX != in_RSI) {
        memcpy(local_48,pFVar4,(long)pdVar1 << 5);
      }
      for (local_98 = 0; local_98 < (long)pdVar1; local_98 = local_98 + 1) {
        TPZFMatrix<Fad<double>_>::operator()
                  (in_stack_ffffffffffffff60,(int64_t)in_RDI,(int64_t)in_RCX);
        Fad<double>::operator*=<double,_nullptr>
                  (in_stack_ffffffffffffff90,
                   (Fad<double> *)CONCAT44(uVar5,in_stack_ffffffffffffff88));
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}